

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockTests.cpp
# Opt level: O1

void __thiscall
vkt::ubo::anon_unknown_0::BlockSingleNestedStructCase::BlockSingleNestedStructCase
          (BlockSingleNestedStructCase *this,TestContext *testCtx,string *name,string *description,
          deUint32 layoutFlags,BufferMode bufferMode,int numInstances,MatrixLoadFlags matrixLoadFlag
          )

{
  ShaderInterface *this_00;
  vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_> *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StructType *this_02;
  StructType *this_03;
  UniformBlock *pUVar2;
  string local_b0;
  Uniform local_90;
  VarType local_50;
  BlockSingleNestedStructCase *local_38;
  
  UniformBlockCase::UniformBlockCase
            (&this->super_UniformBlockCase,testCtx,name,description,bufferMode,matrixLoadFlag,false)
  ;
  (this->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformBlockCase_00d5e540;
  paVar1 = &local_90.m_name.field_2;
  local_90.m_name._M_dataplus._M_p = (pointer)paVar1;
  local_38 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"S","");
  this_00 = &(this->super_UniformBlockCase).m_interface;
  this_02 = ShaderInterface::allocStruct(this_00,&local_90.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_name._M_dataplus._M_p,
                    local_90.m_name.field_2._M_allocated_capacity + 1);
  }
  local_90.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"a","");
  VarType::VarType((VarType *)&local_b0,TYPE_INT_VEC3,4);
  StructType::addMember(this_02,&local_90.m_name,(VarType *)&local_b0,0);
  VarType::~VarType((VarType *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_name._M_dataplus._M_p,
                    local_90.m_name.field_2._M_allocated_capacity + 1);
  }
  local_90.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"b","");
  VarType::VarType(&local_50,TYPE_FLOAT_MAT3,2);
  VarType::VarType((VarType *)&local_b0,&local_50,4);
  StructType::addMember(this_02,&local_90.m_name,(VarType *)&local_b0,0);
  VarType::~VarType((VarType *)&local_b0);
  VarType::~VarType(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_name._M_dataplus._M_p,
                    local_90.m_name.field_2._M_allocated_capacity + 1);
  }
  local_90.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"c","");
  VarType::VarType((VarType *)&local_b0,TYPE_FLOAT_VEC4,4);
  StructType::addMember(this_02,&local_90.m_name,(VarType *)&local_b0,0x1800);
  VarType::~VarType((VarType *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_name._M_dataplus._M_p,
                    local_90.m_name.field_2._M_allocated_capacity + 1);
  }
  local_90.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"T","");
  this_03 = ShaderInterface::allocStruct(this_00,&local_90.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_name._M_dataplus._M_p,
                    local_90.m_name.field_2._M_allocated_capacity + 1);
  }
  local_90.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"a","");
  VarType::VarType((VarType *)&local_b0,TYPE_FLOAT_MAT3,2);
  StructType::addMember(this_03,&local_90.m_name,(VarType *)&local_b0,0);
  VarType::~VarType((VarType *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_name._M_dataplus._M_p,
                    local_90.m_name.field_2._M_allocated_capacity + 1);
  }
  local_90.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"b","");
  VarType::VarType((VarType *)&local_b0,this_02,0);
  StructType::addMember(this_03,&local_90.m_name,(VarType *)&local_b0,0);
  VarType::~VarType((VarType *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_name._M_dataplus._M_p,
                    local_90.m_name.field_2._M_allocated_capacity + 1);
  }
  local_90.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Block","");
  pUVar2 = ShaderInterface::allocBlock(this_00,&local_90.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_name._M_dataplus._M_p,
                    local_90.m_name.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"s","");
  VarType::VarType(&local_50,this_02,0);
  Uniform::Uniform(&local_90,&local_b0,&local_50,0);
  this_01 = &pUVar2->m_uniforms;
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(this_01,&local_90);
  VarType::~VarType(&local_90.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_name._M_dataplus._M_p,
                    local_90.m_name.field_2._M_allocated_capacity + 1);
  }
  VarType::~VarType(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"v","");
  VarType::VarType(&local_50,TYPE_FLOAT_VEC2,1);
  Uniform::Uniform(&local_90,&local_b0,&local_50,0x1800);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(this_01,&local_90);
  VarType::~VarType(&local_90.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_name._M_dataplus._M_p,
                    local_90.m_name.field_2._M_allocated_capacity + 1);
  }
  VarType::~VarType(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"t","");
  VarType::VarType(&local_50,this_03,0);
  Uniform::Uniform(&local_90,&local_b0,&local_50,0);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(this_01,&local_90);
  VarType::~VarType(&local_90.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_name._M_dataplus._M_p,
                    local_90.m_name.field_2._M_allocated_capacity + 1);
  }
  VarType::~VarType(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"u","");
  VarType::VarType(&local_50,TYPE_UINT,4);
  Uniform::Uniform(&local_90,&local_b0,&local_50,0);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(this_01,&local_90);
  VarType::~VarType(&local_90.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_name._M_dataplus._M_p,
                    local_90.m_name.field_2._M_allocated_capacity + 1);
  }
  VarType::~VarType(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  pUVar2->m_flags = layoutFlags;
  if (0 < numInstances) {
    local_90.m_name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"block","");
    std::__cxx11::string::_M_assign((string *)&pUVar2->m_instanceName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.m_name._M_dataplus._M_p != paVar1) {
      operator_delete(local_90.m_name._M_dataplus._M_p,
                      local_90.m_name.field_2._M_allocated_capacity + 1);
    }
    pUVar2->m_arraySize = numInstances;
  }
  (*(local_38->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [2])();
  return;
}

Assistant:

BlockSingleNestedStructCase (tcu::TestContext& testCtx, const std::string& name, const std::string& description, deUint32 layoutFlags, BufferMode bufferMode, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: UniformBlockCase	(testCtx, name, description, bufferMode, matrixLoadFlag)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, PRECISION_HIGH));
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH), UNUSED_BOTH);

		StructType& typeT = m_interface.allocStruct("T");
		typeT.addMember("a", VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM));
		typeT.addMember("b", VarType(&typeS));

		UniformBlock& block = m_interface.allocBlock("Block");
		block.addUniform(Uniform("s", VarType(&typeS), 0));
		block.addUniform(Uniform("v", VarType(glu::TYPE_FLOAT_VEC2, PRECISION_LOW), UNUSED_BOTH));
		block.addUniform(Uniform("t", VarType(&typeT), 0));
		block.addUniform(Uniform("u", VarType(glu::TYPE_UINT, PRECISION_HIGH), 0));
		block.setFlags(layoutFlags);

		if (numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(numInstances);
		}

		init();
	}